

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O2

MiddleVal * __thiscall MiddleVal::operator-=(MiddleVal *this,MiddleVal *t)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  
  bVar1 = std::operator==(&this->Type,"real");
  if (bVar1) {
    dVar2 = this->dVal;
  }
  else {
    dVar2 = (double)this->iVal;
  }
  bVar1 = std::operator==(&t->Type,"real");
  if (bVar1) {
    dVar3 = t->dVal;
  }
  else {
    dVar3 = (double)t->iVal;
  }
  bVar1 = std::operator==(&this->Type,"real");
  if ((!bVar1) && (bVar1 = std::operator==(&t->Type,"real"), !bVar1)) {
    this->iVal = (int)(dVar2 * dVar3);
    return this;
  }
  std::__cxx11::string::assign((char *)this);
  this->dVal = dVar2 * dVar3;
  return this;
}

Assistant:

MiddleVal &MiddleVal::operator-=(MiddleVal t) {
    double result, a, b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    result = a * b;
    if (Type == "real" || t.Type == "real") {
        Type = "real";
        dVal = result;
    } else {
        iVal = (int) result;
    }
    return *this;
}